

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::Shift
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,double shiftX,double shiftY)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  imageException *this;
  uint uVar9;
  long lVar10;
  uchar *puVar11;
  EVP_PKEY_CTX *src;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uchar *__s;
  uchar *__s_00;
  uint uVar18;
  size_t __n;
  ulong __n_00;
  uint uVar19;
  int iVar20;
  uchar *puVar21;
  ulong uVar22;
  uchar *puVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar28 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ImageTemplate<unsigned_char> local_58;
  
  auVar31 = in_ZMM4._0_16_;
  auVar27 = in_ZMM2._0_16_;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  auVar26._8_8_ = in_XMM0_Qb;
  auVar26._0_8_ = shiftX;
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  auVar26 = vandpd_avx512vl(auVar26,auVar4);
  auVar4 = vcvtusi2sd_avx512f(auVar27,width - 1);
  auVar27._8_8_ = in_XMM1_Qb;
  auVar27._0_8_ = shiftY;
  if (auVar26._0_8_ <= auVar4._0_8_) {
    auVar32._8_8_ = 0x7fffffffffffffff;
    auVar32._0_8_ = 0x7fffffffffffffff;
    auVar27 = vandpd_avx512vl(auVar27,auVar32);
    auVar4 = vcvtusi2sd_avx512f(auVar31,height - 1);
    if (auVar27._0_8_ <= auVar4._0_8_) {
      uVar6 = -(int)shiftX;
      uVar9 = -(int)shiftY;
      dVar24 = (double)(int)uVar6 + shiftX;
      dVar25 = (double)(int)uVar9 + shiftY;
      auVar4 = SUB6416(ZEXT864(0),0);
      uVar5 = ~(int)shiftX;
      if (dVar24 <= 0.0) {
        uVar5 = uVar6;
      }
      uVar6 = ~(int)shiftY;
      if (dVar25 <= 0.0) {
        uVar6 = uVar9;
      }
      iVar16 = 0;
      uVar9 = -uVar5 - startXIn;
      if (-uVar5 < startXIn) {
        uVar9 = 0;
      }
      __n = 0;
      if ((0 < (int)uVar5) &&
         (uVar7 = in->_width - 1, uVar18 = width + startXIn + uVar5, __n = (size_t)(uVar18 - uVar7),
         uVar18 < uVar7)) {
        __n = 0;
      }
      uVar7 = -uVar6 - startYIn;
      if (-uVar6 < startYIn) {
        uVar7 = 0;
      }
      uVar7 = (int)uVar6 >> 0x1f & uVar7;
      if ((0 < (int)uVar6) &&
         (uVar18 = in->_height - 1, uVar15 = height + startYIn + uVar6, iVar16 = uVar15 - uVar18,
         uVar15 < uVar18)) {
        iVar16 = 0;
      }
      uVar18 = in->_rowSize;
      uVar14 = (ulong)uVar18;
      uVar15 = out->_rowSize;
      uVar8 = (ulong)uVar15;
      puVar23 = in->_data;
      __s_00 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar15);
      if (uVar15 * uVar7 != 0) {
        uVar22 = 0;
        do {
          memset(__s_00 + uVar22,0,(ulong)width);
          uVar22 = uVar22 + uVar8;
        } while (uVar15 * uVar7 != uVar22);
        __s_00 = __s_00 + uVar22;
        auVar4 = SUB6416(ZEXT864(0),0);
      }
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar25;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar24;
      uVar19 = ((height - uVar7) - iVar16) * uVar15;
      if (uVar19 != 0) {
        uVar1 = vcmpsd_avx512f(auVar34,auVar4 << 0x40,1);
        bVar2 = (bool)((byte)uVar1 & 1);
        uVar1 = vcmpsd_avx512f(auVar31,auVar4 << 0x40,1);
        bVar3 = (bool)((byte)uVar1 & 1);
        dVar24 = (double)((ulong)bVar2 * (long)(dVar24 + 1.0) + (ulong)!bVar2 * (long)dVar24);
        dVar25 = (double)((ulong)bVar3 * (long)(dVar25 + 1.0) + (ulong)!bVar3 * (long)dVar25);
        uVar9 = (int)uVar5 >> 0x1f & uVar9;
        auVar31 = ZEXT816(0x3fe0000000000000);
        auVar32 = ZEXT816(0x40d0000000000000);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar24 * dVar25;
        auVar4 = vfmadd213sd_fma(auVar30,auVar32,auVar31);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = (1.0 - dVar24) * dVar25;
        auVar27 = vfmadd213sd_fma(auVar33,auVar32,auVar31);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = (1.0 - dVar24) * (1.0 - dVar25);
        auVar26 = vfmadd213sd_fma(auVar29,auVar32,auVar31);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar24 * (1.0 - dVar25);
        auVar31 = vfmadd213sd_fma(auVar28,auVar32,auVar31);
        iVar12 = vcvttsd2usi_avx512f(auVar4);
        iVar13 = vcvttsd2usi_avx512f(auVar27);
        __n_00 = (ulong)uVar9;
        lVar10 = (long)(int)(uVar6 * uVar18 + uVar5) + __n_00 + (ulong)startXIn;
        iVar20 = vcvttsd2usi_avx512f(auVar26);
        iVar17 = vcvttsd2usi_avx512f(auVar31);
        puVar11 = __s_00 + uVar19;
        uVar22 = (ulong)(width - (uVar9 + (int)__n));
        puVar21 = puVar23 + lVar10 + (ulong)(startYIn * uVar18) + (ulong)(uVar7 * uVar18) + 1;
        puVar23 = puVar23 + startYIn * uVar18 + uVar14 + lVar10 + (ulong)(uVar7 * uVar18) + 1;
        do {
          memset(__s_00,0,__n_00);
          __s = __s_00;
          if (__s_00 != __s_00 + uVar22 + __n_00) {
            lVar10 = 0;
            do {
              __s_00[lVar10] =
                   (uchar)((uint)puVar23[lVar10] * iVar20 + 0x2000 +
                           (uint)puVar21[lVar10] * iVar13 +
                           (uint)puVar23[lVar10 + -1] * iVar17 + (uint)puVar21[lVar10 + -1] * iVar12
                          >> 0xe);
              lVar10 = lVar10 + 1;
            } while (__n_00 + uVar22 != lVar10);
            __s = __s_00 + lVar10;
          }
          memset(__s,0,__n);
          __s_00 = __s_00 + uVar8;
          puVar21 = puVar21 + uVar14;
          puVar23 = puVar23 + uVar14;
        } while (__s_00 != puVar11);
      }
      if (iVar16 * uVar15 != 0) {
        uVar14 = 0;
        do {
          memset(__s_00 + uVar14,0,(ulong)width);
          uVar14 = uVar14 + uVar8;
        } while (iVar16 * uVar15 != uVar14);
      }
      return;
    }
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Shift value by value bigger than ROI");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Shift( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                uint32_t width, uint32_t height, double shiftX, double shiftY )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if ( (fabs(shiftX) > width - 1) || (fabs(shiftY) > height - 1) )
            throw imageException("Shift value by value bigger than ROI");

        // take a note that we use an opposite values
        int32_t shiftXIntegral = -static_cast<int32_t>( shiftX );
        int32_t shiftYIntegral = -static_cast<int32_t>( shiftY );

        shiftX = shiftX + shiftXIntegral;
        shiftY = shiftY + shiftYIntegral;

        if ( shiftX > 0.0 )
            --shiftXIntegral;

        if ( shiftY > 0.0 )
            --shiftYIntegral;

        const double coeffX = ( shiftX < 0.0 ) ? (1.0 + shiftX) : shiftX;
        const double coeffY = ( shiftY < 0.0 ) ? (1.0 + shiftY) : shiftY;

        // 2^23 = 8388608, 2^23 * 256 is a integer limit
        const uint32_t coeff0 = static_cast<uint32_t>((      coeffX) * (      coeffY) * 16384 + 0.5);
        const uint32_t coeff1 = static_cast<uint32_t>((1.0 - coeffX) * (      coeffY) * 16384 + 0.5);
        const uint32_t coeff2 = static_cast<uint32_t>((1.0 - coeffX) * (1.0 - coeffY) * 16384 + 0.5);
        const uint32_t coeff3 = static_cast<uint32_t>((      coeffX) * (1.0 - coeffY) * 16384 + 0.5);

        const uint32_t limitX = in.width()  - 1u; // we need 2 subsequent pixels so we cannot use last pixel
        const uint32_t limitY = in.height() - 1u;

        const uint32_t emptyLeftArea  = (shiftXIntegral < 0 && startXIn < static_cast<uint32_t>(-shiftXIntegral)) ?
                                        (static_cast<uint32_t>(-shiftXIntegral) - startXIn) : 0u;
        const uint32_t emptyRightArea = (shiftXIntegral > 0 && limitX < startXIn + width + static_cast<uint32_t>(shiftXIntegral)) ?
                                        (startXIn + width + static_cast<uint32_t>(shiftXIntegral) - limitX) : 0u;
        const uint32_t realWidth = width - emptyLeftArea - emptyRightArea;

        const uint32_t emptyTopArea    = (shiftYIntegral < 0 && startYIn < static_cast<uint32_t>(-shiftYIntegral)) ?
                                         (static_cast<uint32_t>(-shiftYIntegral) - startYIn) : 0u;
        const uint32_t emptyBottomArea = (shiftYIntegral > 0 && limitY < startYIn + height + static_cast<uint32_t>(shiftYIntegral)) ?
                                         (startYIn + height + static_cast<uint32_t>(shiftYIntegral) - limitY) : 0u;
        const uint32_t realHeight = height - emptyTopArea - emptyBottomArea;

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        inY += shiftXIntegral + shiftYIntegral * static_cast<int32_t>( rowSizeIn );

        const uint8_t * outYEnd = outY + emptyTopArea * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut )
            memset( outY, 0, width );

        inY += emptyTopArea * rowSizeIn;

        outYEnd = outY + realHeight * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut, inY+=rowSizeIn ) {
            const uint8_t * inX = inY;
            uint8_t * outX = outY;
            const uint8_t * outXEnd = outX + emptyLeftArea + realWidth;

            memset( outX, 0, emptyLeftArea );
            inX += emptyLeftArea;

            for( ; outX != outXEnd; ++outX ) {
                uint32_t data  = (*(inX))  * coeff0;
                data += (*(inX+rowSizeIn)) * coeff3;
                data += (*(++inX))         * coeff1; // here we increment inX
                data += (*(inX+rowSizeIn)) * coeff2;

                *outX = static_cast<uint8_t>((data + 8192) >> 14); // 8192 is 0.5 after calculations
            }

            memset( outX, 0, emptyRightArea );
        }

        outYEnd = outY + emptyBottomArea * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut )
            memset( outY, 0, width );
    }